

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

int calc_maplen(int handle)

{
  ushort uVar1;
  int iVar2;
  global_array_t *pgVar3;
  ulong uVar4;
  
  if (GA[handle].mapc == (C_Integer *)0x0) {
    iVar2 = 0;
  }
  else {
    pgVar3 = GA + handle;
    uVar1 = pgVar3->ndim;
    iVar2 = 0;
    if ((short)uVar1 < 1) {
      uVar1 = 0;
    }
    if (pgVar3->distr_type == 4) {
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        iVar2 = iVar2 + (int)pgVar3->num_blocks[uVar4];
      }
    }
    else {
      for (uVar4 = 0; uVar1 != uVar4; uVar4 = uVar4 + 1) {
        iVar2 = iVar2 + pgVar3->nblock[uVar4];
      }
    }
  }
  return iVar2;
}

Assistant:

static int calc_maplen(int handle)
{
    if (GA[handle].mapc != NULL) {
        int i,len=0;
        if (GA[handle].distr_type != TILED_IRREG) {
          for (i=0; i<GA[handle].ndim; i++) {
            len += GA[handle].nblock[i];
          }
        } else {
          for (i=0; i<GA[handle].ndim; i++) {
            len += GA[handle].num_blocks[i];
          }
        }
        return len;
    }
    return 0;
}